

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

void __thiscall diy::FileStorage::get(FileStorage *this,int i,MemoryBuffer *bb,size_t extra)

{
  int __fd;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  FileRecord fr;
  FileRecord local_48;
  
  extract_file_record(&local_48,this,i);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014f090;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  this_01 = &bb->buffer;
  std::vector<char,_std::allocator<char>_>::reserve(this_01,extra + local_48.size);
  std::vector<char,_std::allocator<char>_>::resize(this_01,local_48.size);
  __fd = open(local_48.name._M_dataplus._M_p,0x101000,0x180);
  read(__fd,(this_01->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start,local_48.size);
  fsync(__fd);
  close(__fd);
  remove_file(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != &local_48.name.field_2) {
    operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void   get(int i, MemoryBuffer& bb, size_t extra) override
      {
        FileRecord fr = extract_file_record(i);

        get_logger()->debug("FileStorage::get(): {}", fr.name);

        bb.buffer.reserve(fr.size + extra);
        bb.buffer.resize(fr.size);
#if defined(_WIN32)
        int fh = -1;
        _sopen_s(&fh, fr.name.c_str(), _O_RDONLY | _O_BINARY, _SH_DENYNO, _S_IREAD);
        _read(fh, &bb.buffer[0], static_cast<unsigned int>(fr.size));
#else
        int fh = open(fr.name.c_str(), O_RDONLY | O_SYNC, 0600);
        auto n = read(fh, &bb.buffer[0], fr.size);
        DIY_UNUSED(n);
#endif
        io::utils::close(fh);
        remove_file(fr);
      }